

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

void testutil_random_fe_magnitude(secp256k1_fe *fe,int m)

{
  uint32_t uVar1;
  long lVar2;
  secp256k1_fe local_38;
  
  uVar1 = testrand_int(m + 1);
  secp256k1_fe_impl_normalize(fe);
  if (uVar1 != 0) {
    lVar2 = (long)(int)(uVar1 - 1);
    local_38.n[0] = lVar2 * 0x1ffffdfffff85e;
    local_38.n[1] = lVar2 * 0x1ffffffffffffe;
    local_38.n[4] = lVar2 * 0x1fffffffffffe;
    local_38.n[2] = local_38.n[1];
    local_38.n[3] = local_38.n[1];
    secp256k1_fe_impl_add(fe,&local_38);
  }
  return;
}

Assistant:

static void testutil_random_fe_magnitude(secp256k1_fe *fe, int m) {
    secp256k1_fe zero;
    int n = testrand_int(m + 1);
    secp256k1_fe_normalize(fe);
    if (n == 0) {
        return;
    }
    secp256k1_fe_set_int(&zero, 0);
    secp256k1_fe_negate(&zero, &zero, 0);
    secp256k1_fe_mul_int_unchecked(&zero, n - 1);
    secp256k1_fe_add(fe, &zero);
#ifdef VERIFY
    CHECK(fe->magnitude == n);
#endif
}